

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::Serialize(DLevelScript *this,FArchive *arc)

{
  FBehavior *pFVar1;
  FArchive *pFVar2;
  SDWORD *pSVar3;
  long lVar4;
  ulong uVar5;
  uint local_30;
  WORD lib_1;
  WORD lib;
  
  DObject::Serialize(&this->super_DObject,arc);
  P_SerializeACSScriptNumber(arc,&this->script,false);
  pFVar2 = ::operator<<(arc,&this->state);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->statedata);
  pFVar2 = ::operator<<(pFVar2,(AActor **)&this->activator);
  pFVar2 = ::operator<<(pFVar2,&this->activationline);
  pFVar2 = FArchive::operator<<(pFVar2,&this->backSide);
  FArchive::operator<<(pFVar2,(DWORD *)&this->numlocalvars);
  if (arc->m_Loading == true) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)this->numlocalvars) {
      uVar5 = (long)this->numlocalvars * 4;
    }
    pSVar3 = (SDWORD *)operator_new__(uVar5);
    this->localvars = pSVar3;
  }
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (uint)this->numlocalvars; uVar5 = uVar5 + 1) {
    FArchive::operator<<(arc,(DWORD *)((long)this->localvars + lVar4));
    lVar4 = lVar4 + 4;
  }
  local_30 = (uint)uVar5;
  if (arc->m_Storing == true) {
    lib = (WORD)((int)this->activeBehavior->LibraryID >> 0x14);
    FArchive::operator<<(arc,&lib);
    local_30 = *(int *)&this->pc - *(int *)&this->activeBehavior->Data;
    FArchive::operator<<(arc,&local_30);
  }
  else {
    pFVar2 = FArchive::operator<<(arc,&lib_1);
    FArchive::operator<<(pFVar2,&local_30);
    pFVar1 = FBehavior::StaticModules.Array[lib_1];
    this->activeBehavior = pFVar1;
    this->pc = (int *)(pFVar1->Data + local_30);
  }
  pFVar2 = SerializeFFontPtr(arc,&this->activefont);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->hudwidth);
  FArchive::operator<<(pFVar2,(DWORD *)&this->hudheight);
  pFVar2 = FArchive::operator<<(arc,(DWORD *)&this->ClipRectLeft);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectTop);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectWidth);
  pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&this->ClipRectHeight);
  FArchive::operator<<(pFVar2,(DWORD *)&this->WrapWidth);
  FArchive::operator<<(arc,(DWORD *)&this->InModuleScriptNumber);
  return;
}

Assistant:

void DLevelScript::Serialize (FArchive &arc)
{
	DWORD i;

	Super::Serialize (arc);

	P_SerializeACSScriptNumber(arc, script, false);

	arc	<< state
		<< statedata
		<< activator
		<< activationline
		<< backSide
		<< numlocalvars;

	if (arc.IsLoading())
	{
		localvars = new SDWORD[numlocalvars];
	}
	for (i = 0; i < (DWORD)numlocalvars; i++)
	{
		arc << localvars[i];
	}

	if (arc.IsStoring ())
	{
		WORD lib = activeBehavior->GetLibraryID() >> LIBRARYID_SHIFT;
		arc << lib;
		i = activeBehavior->PC2Ofs (pc);
		arc << i;
	}
	else
	{
		WORD lib;
		arc << lib << i;
		activeBehavior = FBehavior::StaticGetModule (lib);
		pc = activeBehavior->Ofs2PC (i);
	}

	arc << activefont
		<< hudwidth << hudheight;
	arc << ClipRectLeft << ClipRectTop << ClipRectWidth << ClipRectHeight
		<< WrapWidth;
	arc << InModuleScriptNumber;
}